

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

ssize_t correct_convolutional_sse_decode_soft
                  (correct_convolutional_sse *conv,soft_t *encoded,size_t num_encoded_bits,
                  uint8_t *msg)

{
  ssize_t sVar1;
  
  if (num_encoded_bits % (conv->base_conv).rate != 0) {
    return -1;
  }
  sVar1 = _convolutional_sse_decode
                    (conv,num_encoded_bits,
                     ((num_encoded_bits >> 3) + 1) - (ulong)((num_encoded_bits & 7) == 0),msg,
                     encoded);
  return sVar1;
}

Assistant:

ssize_t correct_convolutional_sse_decode_soft(correct_convolutional_sse *conv, const soft_t *encoded,
                                              size_t num_encoded_bits, uint8_t *msg) {
    if (num_encoded_bits % conv->base_conv.rate) {
        // XXX turn this into an error code
        // printf("encoded length of message must be a multiple of rate\n");
        return -1;
    }

    size_t num_encoded_bytes =
        (num_encoded_bits % 8) ? (num_encoded_bits / 8 + 1) : (num_encoded_bits / 8);

    return _convolutional_sse_decode(conv, num_encoded_bits, num_encoded_bytes, msg, encoded);
}